

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O1

char * getenv(char *__name)

{
  bool bVar1;
  stCoRoutine_t *psVar2;
  void *pvVar3;
  char *pcVar4;
  stCoSysEnvArr_t *psVar5;
  stCoSysEnv_t name;
  char *local_20;
  undefined8 local_18;
  
  psVar5 = (stCoSysEnvArr_t *)__name;
  if (g_sys_getenv_func == (getenv_pfn_t)0x0) {
    psVar5 = (stCoSysEnvArr_t *)0xffffffffffffffff;
    g_sys_getenv_func = (getenv_pfn_t)dlsym(0xffffffffffffffff,"getenv");
  }
  bVar1 = co_is_enable_sys_hook();
  if (bVar1 && _ZL11g_co_sysenv_0 != 0) {
    psVar2 = co_self();
    local_18 = 0;
    local_20 = __name;
    if (psVar2->pvEnv == (void *)0x0) {
      psVar5 = dup_co_sysenv_arr(psVar5);
      psVar2->pvEnv = psVar5;
    }
    pvVar3 = bsearch(&local_20,*psVar2->pvEnv,*(size_t *)((long)psVar2->pvEnv + 8),0x10,
                     co_sysenv_comp);
    if (pvVar3 != (void *)0x0) {
      return *(char **)((long)pvVar3 + 8);
    }
  }
  pcVar4 = (*g_sys_getenv_func)(__name);
  return pcVar4;
}

Assistant:

char *getenv( const char *n )
{
	HOOK_SYS_FUNC( getenv )
	if( co_is_enable_sys_hook() && g_co_sysenv.data )
	{
		stCoRoutine_t *self = co_self();

		stCoSysEnv_t name = { (char*)n,0 };

		if( !self->pvEnv )
		{
			self->pvEnv = dup_co_sysenv_arr( &g_co_sysenv );
		}
		stCoSysEnvArr_t *arr = (stCoSysEnvArr_t*)(self->pvEnv);

		stCoSysEnv_t *e = (stCoSysEnv_t*)bsearch( &name,arr->data,arr->cnt,sizeof(name),co_sysenv_comp );

		if( e )
		{
			return e->value;
		}

	}
	return g_sys_getenv_func( n );

}